

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutSopBalanceEvalIntInt
              (Vec_Int_t *vCover,int nLeaves,int *pTimes,Vec_Int_t *vAig,int fCompl,int *pArea)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  int iRes;
  int pFaninLits [15];
  uint local_6c;
  int local_68 [18];
  long lVar5;
  
  local_6c = 0;
  if (vAig == (Vec_Int_t *)0x0) {
    iVar1 = If_CutSopBalanceEvalInt
                      (vCover,pTimes,local_68,(Vec_Int_t *)0x0,(int *)&local_6c,nLeaves,pArea);
  }
  else {
    if (0 < nLeaves) {
      lVar2 = (ulong)(uint)nLeaves - 1;
      auVar3._8_4_ = (int)lVar2;
      auVar3._0_8_ = lVar2;
      auVar3._12_4_ = (int)((ulong)lVar2 >> 0x20);
      lVar2 = 0;
      auVar3 = auVar3 ^ _DAT_0094e250;
      auVar4 = _DAT_0094e240;
      do {
        auVar6 = auVar4 ^ _DAT_0094e250;
        if ((bool)(~(auVar6._4_4_ == auVar3._4_4_ && auVar3._0_4_ < auVar6._0_4_ ||
                    auVar3._4_4_ < auVar6._4_4_) & 1)) {
          *(int *)((long)local_68 + lVar2 * 2) = (int)lVar2;
        }
        if ((auVar6._12_4_ != auVar3._12_4_ || auVar6._8_4_ <= auVar3._8_4_) &&
            auVar6._12_4_ <= auVar3._12_4_) {
          *(int *)((long)local_68 + lVar2 * 2 + 4) = (int)lVar2 + 2;
        }
        lVar5 = auVar4._8_8_;
        auVar4._0_8_ = auVar4._0_8_ + 2;
        auVar4._8_8_ = lVar5 + 2;
        lVar2 = lVar2 + 4;
      } while ((ulong)(nLeaves + 1U >> 1) << 2 != lVar2);
    }
    iVar1 = If_CutSopBalanceEvalInt(vCover,pTimes,local_68,vAig,(int *)&local_6c,nLeaves,pArea);
    if (iVar1 == -1) {
      iVar1 = -1;
    }
    else {
      if (((int)local_6c < 0) || (vAig->nSize < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (local_6c >> 1 != (((uint)vAig->nSize >> 1) + nLeaves) - 1) {
        __assert_fail("vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xf2,
                      "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                     );
      }
      Vec_IntPush(vAig,local_6c & 1 ^ fCompl);
      if ((vAig->nSize & 1) == 0) {
        __assert_fail("vAig == NULL || (Vec_IntSize(vAig) & 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xf5,
                      "int If_CutSopBalanceEvalIntInt(Vec_Int_t *, int, int *, Vec_Int_t *, int, int *)"
                     );
      }
    }
  }
  return iVar1;
}

Assistant:

int If_CutSopBalanceEvalIntInt( Vec_Int_t * vCover, int nLeaves, int * pTimes, Vec_Int_t * vAig, int fCompl, int * pArea ) 
{
    int pFaninLits[IF_MAX_FUNC_LUTSIZE];
    int iRes = 0, Res, k;
    if ( vAig )
        for ( k = 0; k < nLeaves; k++ )
            pFaninLits[k] = Abc_Var2Lit(k, 0);
    Res = If_CutSopBalanceEvalInt( vCover, pTimes, pFaninLits, vAig, &iRes, nLeaves, pArea );
    if ( Res == -1 )
        return -1;
    assert( vAig == NULL || Abc_Lit2Var(iRes) == nLeaves + Abc_Lit2Var(Vec_IntSize(vAig)) - 1 );
    if ( vAig )
        Vec_IntPush( vAig, Abc_LitIsCompl(iRes) ^ fCompl );
    assert( vAig == NULL || (Vec_IntSize(vAig) & 1) );
    return Res;
}